

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O1

void ConvertARGBToUV_SSE2(uint32_t *argb,uint8_t *u,uint8_t *v,int src_width,int do_store)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  short sVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ushort uVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ushort uVar76;
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined3 uVar115;
  undefined3 uVar116;
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  uint uVar133;
  uint uVar134;
  undefined5 uVar135;
  undefined5 uVar136;
  undefined1 auVar137 [12];
  undefined1 auVar138 [12];
  undefined1 auVar139 [12];
  undefined1 auVar140 [12];
  undefined1 auVar141 [14];
  undefined1 auVar142 [14];
  undefined1 auVar143 [14];
  undefined1 auVar144 [14];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  ulong uVar150;
  int src_width_00;
  uint8_t uVar151;
  uint8_t uVar165;
  uint8_t uVar166;
  uint8_t uVar167;
  uint8_t uVar168;
  uint8_t uVar169;
  uint8_t uVar170;
  uint8_t uVar171;
  uint8_t uVar172;
  uint8_t uVar173;
  uint8_t uVar174;
  uint8_t uVar175;
  uint8_t uVar176;
  uint8_t uVar177;
  uint8_t uVar178;
  undefined1 auVar152 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  uint8_t uVar179;
  uint8_t uVar180;
  uint8_t uVar191;
  uint8_t uVar192;
  uint8_t uVar193;
  uint8_t uVar194;
  uint8_t uVar195;
  uint8_t uVar196;
  uint8_t uVar197;
  uint8_t uVar198;
  uint8_t uVar199;
  uint8_t uVar200;
  uint8_t uVar201;
  uint8_t uVar202;
  uint8_t uVar203;
  uint8_t uVar204;
  undefined1 auVar181 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  uint8_t uVar205;
  undefined1 auVar206 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar306 [16];
  undefined1 auVar314 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar153 [16];
  undefined1 auVar162 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar163 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar207 [16];
  undefined1 auVar218 [16];
  undefined1 auVar208 [16];
  undefined1 auVar219 [16];
  undefined1 auVar209 [16];
  undefined1 auVar220 [16];
  undefined1 auVar210 [16];
  undefined1 auVar221 [16];
  undefined1 auVar211 [16];
  undefined1 auVar222 [16];
  undefined1 auVar212 [16];
  undefined1 auVar223 [16];
  undefined1 auVar213 [16];
  undefined1 auVar224 [16];
  undefined1 auVar243 [16];
  undefined1 auVar248 [16];
  undefined1 auVar257 [16];
  undefined1 auVar234 [16];
  undefined1 auVar249 [16];
  undefined1 auVar235 [16];
  undefined1 auVar244 [16];
  undefined1 auVar250 [16];
  undefined1 auVar258 [16];
  undefined1 auVar236 [16];
  undefined1 auVar251 [16];
  undefined1 auVar237 [16];
  undefined1 auVar245 [16];
  undefined1 auVar252 [16];
  undefined1 auVar259 [16];
  undefined1 auVar238 [16];
  undefined1 auVar253 [16];
  undefined1 auVar239 [16];
  undefined1 auVar254 [16];
  undefined1 uVar261;
  undefined1 auVar263 [16];
  undefined1 auVar272 [16];
  undefined1 auVar264 [16];
  undefined1 auVar273 [16];
  undefined1 auVar265 [16];
  undefined1 auVar274 [16];
  undefined1 auVar266 [16];
  undefined1 auVar275 [16];
  undefined1 auVar267 [16];
  undefined1 auVar276 [16];
  undefined1 auVar268 [16];
  undefined1 auVar277 [16];
  undefined1 auVar269 [16];
  undefined1 auVar278 [16];
  undefined1 uVar282;
  undefined1 auVar284 [16];
  undefined1 auVar294 [16];
  undefined1 auVar303 [16];
  undefined1 auVar285 [16];
  undefined1 auVar295 [16];
  undefined1 auVar286 [16];
  undefined1 auVar296 [16];
  undefined1 auVar304 [16];
  undefined1 auVar287 [16];
  undefined1 auVar297 [16];
  undefined1 auVar288 [16];
  undefined1 auVar298 [16];
  undefined1 auVar305 [16];
  undefined1 auVar289 [16];
  undefined1 auVar299 [16];
  undefined1 auVar290 [16];
  undefined1 auVar300 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  
  auVar149 = _DAT_001b89a0;
  auVar148 = _DAT_001b8990;
  auVar147 = _DAT_001b8970;
  auVar146 = _DAT_001b8960;
  auVar145 = _DAT_001b8950;
  if ((int)(src_width & 0xffffffe0U) < 1) {
    uVar150 = 0;
  }
  else {
    uVar150 = 0;
    do {
      auVar160 = *(undefined1 (*) [16])(argb + uVar150);
      puVar1 = argb + uVar150 + 4;
      uVar40 = *(undefined1 *)((long)puVar1 + 3);
      uVar41 = *(undefined1 *)((long)puVar1 + 5);
      uVar42 = *(undefined1 *)((long)puVar1 + 9);
      uVar43 = *(undefined1 *)((long)puVar1 + 0xe);
      auVar215 = *(undefined1 (*) [16])(argb + uVar150 + 8);
      puVar2 = argb + uVar150 + 0xc;
      uVar44 = *(undefined1 *)((long)puVar2 + 3);
      uVar45 = *(undefined1 *)((long)puVar2 + 5);
      uVar46 = *(undefined1 *)((long)puVar2 + 9);
      uVar47 = *(undefined1 *)((long)puVar2 + 0xe);
      auVar239._0_14_ = auVar160._0_14_;
      auVar239[0xe] = auVar160[7];
      auVar239[0xf] = *(undefined1 *)((long)puVar1 + 7);
      auVar238._14_2_ = auVar239._14_2_;
      auVar238._0_13_ = auVar160._0_13_;
      auVar238[0xd] = *(undefined1 *)((long)puVar1 + 6);
      auVar237._13_3_ = auVar238._13_3_;
      auVar237._0_12_ = auVar160._0_12_;
      auVar237[0xc] = auVar160[6];
      auVar236._12_4_ = auVar237._12_4_;
      auVar236._0_11_ = auVar160._0_11_;
      auVar236[0xb] = uVar41;
      uVar261 = auVar160[5];
      auVar235._11_5_ = auVar236._11_5_;
      auVar235._0_10_ = auVar160._0_10_;
      auVar235[10] = uVar261;
      auVar234._10_6_ = auVar235._10_6_;
      auVar234._0_9_ = auVar160._0_9_;
      auVar234[9] = (char)puVar1[1];
      auVar233._9_7_ = auVar234._9_7_;
      auVar233._0_8_ = auVar160._0_8_;
      auVar233[8] = auVar160[4];
      auVar49._1_8_ = auVar233._8_8_;
      auVar49[0] = uVar40;
      auVar49._9_7_ = 0;
      auVar48._10_6_ = 0;
      auVar48._0_10_ = SUB1610(auVar49 << 0x38,6);
      auVar280._11_5_ = 0;
      auVar280._0_11_ = SUB1611(auVar48 << 0x30,5);
      auVar246._12_4_ = 0;
      auVar246._0_12_ = SUB1612(auVar280 << 0x28,4);
      auVar241._13_3_ = 0;
      auVar241._0_13_ = SUB1613(auVar246 << 0x20,3);
      auVar292._14_2_ = 0;
      auVar292._0_14_ = SUB1614(auVar241 << 0x18,2);
      auVar292 = auVar292 << 0x10;
      auVar269._0_14_ = auVar215._0_14_;
      auVar269[0xe] = auVar215[7];
      auVar269[0xf] = *(undefined1 *)((long)puVar2 + 7);
      auVar268._14_2_ = auVar269._14_2_;
      auVar268._0_13_ = auVar215._0_13_;
      auVar268[0xd] = *(undefined1 *)((long)puVar2 + 6);
      auVar267._13_3_ = auVar268._13_3_;
      auVar267._0_12_ = auVar215._0_12_;
      auVar267[0xc] = auVar215[6];
      auVar266._12_4_ = auVar267._12_4_;
      auVar266._0_11_ = auVar215._0_11_;
      auVar266[0xb] = uVar45;
      uVar282 = auVar215[5];
      auVar265._11_5_ = auVar266._11_5_;
      auVar265._0_10_ = auVar215._0_10_;
      auVar265[10] = uVar282;
      auVar264._10_6_ = auVar265._10_6_;
      auVar264._0_9_ = auVar215._0_9_;
      auVar264[9] = (char)puVar2[1];
      auVar263._9_7_ = auVar264._9_7_;
      auVar263._0_8_ = auVar215._0_8_;
      auVar263[8] = auVar215[4];
      auVar54._1_8_ = auVar263._8_8_;
      auVar54[0] = uVar44;
      auVar54._9_7_ = 0;
      auVar53._10_6_ = 0;
      auVar53._0_10_ = SUB1610(auVar54 << 0x38,6);
      auVar52._11_5_ = 0;
      auVar52._0_11_ = SUB1611(auVar53 << 0x30,5);
      auVar51._12_4_ = 0;
      auVar51._0_12_ = SUB1612(auVar52 << 0x28,4);
      auVar50._13_3_ = 0;
      auVar50._0_13_ = SUB1613(auVar51 << 0x20,3);
      auVar262._14_2_ = 0;
      auVar262._0_14_ = SUB1614(auVar50 << 0x18,2);
      auVar262 = auVar262 << 0x10;
      auVar213._0_14_ = auVar292._0_14_;
      auVar213[0xe] = uVar40;
      auVar213[0xf] = *(undefined1 *)((long)puVar1 + 0xb);
      auVar212._14_2_ = auVar213._14_2_;
      auVar212._0_13_ = auVar292._0_13_;
      auVar212[0xd] = auVar160[0xb];
      auVar211._13_3_ = auVar212._13_3_;
      auVar211._0_12_ = auVar292._0_12_;
      auVar211[0xc] = auVar160[3];
      auVar210._12_4_ = auVar211._12_4_;
      auVar210._0_11_ = auVar292._0_11_;
      auVar210[0xb] = *(undefined1 *)((long)puVar1 + 10);
      auVar209._11_5_ = auVar210._11_5_;
      auVar209._0_10_ = auVar292._0_10_;
      auVar209[10] = *(undefined1 *)((long)puVar1 + 2);
      auVar208._10_6_ = auVar209._10_6_;
      auVar208._0_9_ = auVar292._0_9_;
      auVar208[9] = auVar160[10];
      auVar207._9_7_ = auVar208._9_7_;
      auVar207._0_8_ = auVar292._0_8_;
      auVar207[8] = auVar160[2];
      auVar59._1_8_ = auVar207._8_8_;
      auVar59[0] = uVar42;
      auVar59._9_7_ = 0;
      auVar58._10_6_ = 0;
      auVar58._0_10_ = SUB1610(auVar59 << 0x38,6);
      auVar57._11_5_ = 0;
      auVar57._0_11_ = SUB1611(auVar58 << 0x30,5);
      auVar56._12_4_ = 0;
      auVar56._0_12_ = SUB1612(auVar57 << 0x28,4);
      auVar55._13_3_ = 0;
      auVar55._0_13_ = SUB1613(auVar56 << 0x20,3);
      auVar206._14_2_ = 0;
      auVar206._0_14_ = SUB1614(auVar55 << 0x18,2);
      auVar206 = auVar206 << 0x10;
      auVar290._0_14_ = auVar262._0_14_;
      auVar290[0xe] = uVar44;
      auVar290[0xf] = *(undefined1 *)((long)puVar2 + 0xb);
      auVar289._14_2_ = auVar290._14_2_;
      auVar289._0_13_ = auVar262._0_13_;
      auVar289[0xd] = auVar215[0xb];
      auVar288._13_3_ = auVar289._13_3_;
      auVar288._0_12_ = auVar262._0_12_;
      auVar288[0xc] = auVar215[3];
      auVar287._12_4_ = auVar288._12_4_;
      auVar287._0_11_ = auVar262._0_11_;
      auVar287[0xb] = *(undefined1 *)((long)puVar2 + 10);
      auVar286._11_5_ = auVar287._11_5_;
      auVar286._0_10_ = auVar262._0_10_;
      auVar286[10] = *(undefined1 *)((long)puVar2 + 2);
      auVar285._10_6_ = auVar286._10_6_;
      auVar285._0_9_ = auVar262._0_9_;
      auVar285[9] = auVar215[10];
      auVar284._9_7_ = auVar285._9_7_;
      auVar284._0_8_ = auVar262._0_8_;
      auVar284[8] = auVar215[2];
      auVar64._1_8_ = auVar284._8_8_;
      auVar64[0] = uVar46;
      auVar64._9_7_ = 0;
      auVar63._10_6_ = 0;
      auVar63._0_10_ = SUB1610(auVar64 << 0x38,6);
      auVar62._11_5_ = 0;
      auVar62._0_11_ = SUB1611(auVar63 << 0x30,5);
      auVar61._12_4_ = 0;
      auVar61._0_12_ = SUB1612(auVar62 << 0x28,4);
      auVar60._13_3_ = 0;
      auVar60._0_13_ = SUB1613(auVar61 << 0x20,3);
      auVar283._14_2_ = 0;
      auVar283._0_14_ = SUB1614(auVar60 << 0x18,2);
      auVar283 = auVar283 << 0x10;
      auVar188._0_14_ = auVar206._0_14_;
      auVar188[0xe] = uVar42;
      auVar188[0xf] = *(undefined1 *)((long)puVar1 + 0xd);
      auVar187._14_2_ = auVar188._14_2_;
      auVar187._0_13_ = auVar206._0_13_;
      auVar187[0xd] = uVar41;
      auVar186._13_3_ = auVar187._13_3_;
      auVar186._0_12_ = auVar206._0_12_;
      auVar186[0xc] = *(undefined1 *)((long)puVar1 + 1);
      auVar185._12_4_ = auVar186._12_4_;
      auVar185._0_11_ = auVar206._0_11_;
      auVar185[0xb] = auVar160[0xd];
      auVar184._11_5_ = auVar185._11_5_;
      auVar184._0_10_ = auVar206._0_10_;
      auVar184[10] = auVar160[9];
      auVar183._10_6_ = auVar184._10_6_;
      auVar183._0_9_ = auVar206._0_9_;
      auVar183[9] = uVar261;
      auVar182._9_7_ = auVar183._9_7_;
      auVar182._0_8_ = auVar206._0_8_;
      auVar182[8] = auVar160[1];
      auVar69._1_8_ = auVar182._8_8_;
      auVar69[0] = (char)puVar1[3];
      auVar69._9_7_ = 0;
      auVar68._10_6_ = 0;
      auVar68._0_10_ = SUB1610(auVar69 << 0x38,6);
      auVar67._11_5_ = 0;
      auVar67._0_11_ = SUB1611(auVar68 << 0x30,5);
      auVar66._12_4_ = 0;
      auVar66._0_12_ = SUB1612(auVar67 << 0x28,4);
      auVar65._13_3_ = 0;
      auVar65._0_13_ = SUB1613(auVar66 << 0x20,3);
      auVar181._14_2_ = 0;
      auVar181._0_14_ = SUB1614(auVar65 << 0x18,2);
      auVar181 = auVar181 << 0x10;
      uVar70 = CONCAT11(auVar160[3],uVar43);
      uVar115 = CONCAT12(auVar160[7],uVar70);
      uVar133 = CONCAT13(auVar160[0xb],uVar115);
      uVar135 = CONCAT14(auVar160[0xf],uVar133);
      auVar141[5] = uVar40;
      auVar141._0_5_ = uVar135;
      auVar159._0_14_ = auVar283._0_14_;
      auVar159[0xe] = uVar46;
      auVar159[0xf] = *(undefined1 *)((long)puVar2 + 0xd);
      auVar158._14_2_ = auVar159._14_2_;
      auVar158._0_13_ = auVar283._0_13_;
      auVar158[0xd] = uVar45;
      auVar157._13_3_ = auVar158._13_3_;
      auVar157._0_12_ = auVar283._0_12_;
      auVar157[0xc] = *(undefined1 *)((long)puVar2 + 1);
      auVar156._12_4_ = auVar157._12_4_;
      auVar156._0_11_ = auVar283._0_11_;
      auVar156[0xb] = auVar215[0xd];
      auVar155._11_5_ = auVar156._11_5_;
      auVar155._0_10_ = auVar283._0_10_;
      auVar155[10] = auVar215[9];
      auVar154._10_6_ = auVar155._10_6_;
      auVar154._0_9_ = auVar283._0_9_;
      auVar154[9] = uVar282;
      auVar153._9_7_ = auVar154._9_7_;
      auVar153._0_8_ = auVar283._0_8_;
      auVar153[8] = auVar215[1];
      auVar75._1_8_ = auVar153._8_8_;
      auVar75[0] = (char)puVar2[3];
      auVar75._9_7_ = 0;
      auVar74._10_6_ = 0;
      auVar74._0_10_ = SUB1610(auVar75 << 0x38,6);
      auVar73._11_5_ = 0;
      auVar73._0_11_ = SUB1611(auVar74 << 0x30,5);
      auVar72._12_4_ = 0;
      auVar72._0_12_ = SUB1612(auVar73 << 0x28,4);
      auVar71._13_3_ = 0;
      auVar71._0_13_ = SUB1613(auVar72 << 0x20,3);
      auVar152._14_2_ = 0;
      auVar152._0_14_ = SUB1614(auVar71 << 0x18,2);
      auVar152 = auVar152 << 0x10;
      uVar76 = CONCAT11(auVar215[3],uVar47);
      uVar116 = CONCAT12(auVar215[7],uVar76);
      uVar134 = CONCAT13(auVar215[0xb],uVar116);
      uVar136 = CONCAT14(auVar215[0xf],uVar134);
      auVar142[5] = uVar44;
      auVar142._0_5_ = uVar136;
      auVar141._6_8_ = 0;
      auVar4[0xe] = uVar43;
      auVar4._0_14_ = auVar141 << 0x38;
      auVar137._4_8_ = 0;
      auVar137._0_4_ = uVar133;
      auVar16._12_3_ =
           (int3)(CONCAT26(auVar4._13_2_,CONCAT15(*(undefined1 *)((long)puVar1 + 10),uVar135)) >>
                 0x28);
      auVar16._0_12_ = auVar137 << 0x38;
      auVar28._10_5_ =
           (int5)(CONCAT44(auVar16._11_4_,CONCAT13(*(undefined1 *)((long)puVar1 + 6),uVar115)) >>
                 0x18);
      auVar28._0_10_ = (unkuint10)uVar70 << 0x38;
      auVar77._7_8_ = 0;
      auVar77._0_7_ =
           (uint7)(CONCAT62(auVar28._9_6_,CONCAT11(*(undefined1 *)((long)puVar1 + 2),uVar43)) >> 8);
      auVar117._1_8_ = SUB158(auVar77 << 0x40,7);
      auVar117[0] = auVar160[0xe];
      auVar117._9_6_ = 0;
      auVar118._1_10_ = SUB1510(auVar117 << 0x30,5);
      auVar118[0] = auVar160[10];
      auVar118._11_4_ = 0;
      auVar214._3_12_ = SUB1512(auVar118 << 0x20,3);
      auVar214[2] = auVar160[6];
      auVar214[1] = 0;
      auVar214[0] = auVar160[2];
      auVar214[0xf] = 0;
      auVar142._6_8_ = 0;
      auVar5[0xe] = uVar47;
      auVar5._0_14_ = auVar142 << 0x38;
      auVar138._4_8_ = 0;
      auVar138._0_4_ = uVar134;
      auVar17._12_3_ =
           (int3)(CONCAT26(auVar5._13_2_,CONCAT15(*(undefined1 *)((long)puVar2 + 10),uVar136)) >>
                 0x28);
      auVar17._0_12_ = auVar138 << 0x38;
      auVar29._10_5_ =
           (int5)(CONCAT44(auVar17._11_4_,CONCAT13(*(undefined1 *)((long)puVar2 + 6),uVar116)) >>
                 0x18);
      auVar29._0_10_ = (unkuint10)uVar76 << 0x38;
      auVar78._7_8_ = 0;
      auVar78._0_7_ =
           (uint7)(CONCAT62(auVar29._9_6_,CONCAT11(*(undefined1 *)((long)puVar2 + 2),uVar47)) >> 8);
      auVar119._1_8_ = SUB158(auVar78 << 0x40,7);
      auVar119[0] = auVar215[0xe];
      auVar119._9_6_ = 0;
      auVar120._1_10_ = SUB1510(auVar119 << 0x30,5);
      auVar120[0] = auVar215[10];
      auVar120._11_4_ = 0;
      auVar291._3_12_ = SUB1512(auVar120 << 0x20,3);
      auVar291[2] = auVar215[6];
      auVar291[1] = 0;
      auVar291[0] = auVar215[2];
      auVar291[0xf] = 0;
      auVar227[1] = 0;
      auVar227[0] = auVar160[1];
      auVar227[2] = uVar261;
      auVar227[3] = 0;
      auVar227[4] = auVar160[9];
      auVar227[5] = 0;
      auVar227[6] = auVar160[0xd];
      auVar227[7] = 0;
      auVar227[8] = *(undefined1 *)((long)puVar1 + 1);
      auVar227[9] = 0;
      auVar227[10] = uVar41;
      auVar227[0xb] = 0;
      auVar227[0xc] = uVar42;
      auVar227[0xd] = 0;
      auVar227[0xe] = *(undefined1 *)((long)puVar1 + 0xd);
      auVar227[0xf] = 0;
      auVar240[1] = 0;
      auVar240[0] = auVar215[1];
      auVar240[2] = uVar282;
      auVar240[3] = 0;
      auVar240[4] = auVar215[9];
      auVar240[5] = 0;
      auVar240[6] = auVar215[0xd];
      auVar240[7] = 0;
      auVar240[8] = *(undefined1 *)((long)puVar2 + 1);
      auVar240[9] = 0;
      auVar240[10] = uVar45;
      auVar240[0xb] = 0;
      auVar240[0xc] = uVar46;
      auVar240[0xd] = 0;
      auVar240[0xe] = *(undefined1 *)((long)puVar2 + 0xd);
      auVar240[0xf] = 0;
      auVar6[0xd] = 0;
      auVar6._0_13_ = auVar181._0_13_;
      auVar6[0xe] = (char)puVar1[3];
      auVar12[0xc] = (char)puVar1[2];
      auVar12._0_12_ = auVar181._0_12_;
      auVar12._13_2_ = auVar6._13_2_;
      auVar18[0xb] = 0;
      auVar18._0_11_ = auVar181._0_11_;
      auVar18._12_3_ = auVar12._12_3_;
      auVar24[10] = (char)puVar1[1];
      auVar24._0_10_ = auVar181._0_10_;
      auVar24._11_4_ = auVar18._11_4_;
      auVar30[9] = 0;
      auVar30._0_9_ = auVar181._0_9_;
      auVar30._10_5_ = auVar24._10_5_;
      auVar36[8] = (char)*puVar1;
      auVar36._0_8_ = auVar181._0_8_;
      auVar36._9_6_ = auVar30._9_6_;
      auVar79._7_8_ = 0;
      auVar79._0_7_ = auVar36._8_7_;
      auVar121._1_8_ = SUB158(auVar79 << 0x40,7);
      auVar121[0] = auVar160[0xc];
      auVar121._9_6_ = 0;
      auVar122._1_10_ = SUB1510(auVar121 << 0x30,5);
      auVar122[0] = auVar160[8];
      auVar122._11_4_ = 0;
      auVar189._3_12_ = SUB1512(auVar122 << 0x20,3);
      auVar189[2] = auVar160[4];
      auVar189[1] = 0;
      auVar189[0] = auVar160[0];
      auVar189[0xf] = 0;
      auVar7[0xd] = 0;
      auVar7._0_13_ = auVar152._0_13_;
      auVar7[0xe] = (char)puVar2[3];
      auVar13[0xc] = (char)puVar2[2];
      auVar13._0_12_ = auVar152._0_12_;
      auVar13._13_2_ = auVar7._13_2_;
      auVar19[0xb] = 0;
      auVar19._0_11_ = auVar152._0_11_;
      auVar19._12_3_ = auVar13._12_3_;
      auVar25[10] = (char)puVar2[1];
      auVar25._0_10_ = auVar152._0_10_;
      auVar25._11_4_ = auVar19._11_4_;
      auVar31[9] = 0;
      auVar31._0_9_ = auVar152._0_9_;
      auVar31._10_5_ = auVar25._10_5_;
      auVar37[8] = (char)*puVar2;
      auVar37._0_8_ = auVar152._0_8_;
      auVar37._9_6_ = auVar31._9_6_;
      auVar80._7_8_ = 0;
      auVar80._0_7_ = auVar37._8_7_;
      auVar123._1_8_ = SUB158(auVar80 << 0x40,7);
      auVar123[0] = auVar215[0xc];
      auVar123._9_6_ = 0;
      auVar124._1_10_ = SUB1510(auVar123 << 0x30,5);
      auVar124[0] = auVar215[8];
      auVar124._11_4_ = 0;
      auVar160._3_12_ = SUB1512(auVar124 << 0x20,3);
      auVar160[2] = auVar215[4];
      auVar160[1] = 0;
      auVar160[0] = auVar215[0];
      auVar160[0xf] = 0;
      auVar215 = pmaddwd(auVar214,auVar145);
      auVar292 = pmaddwd(auVar291,auVar145);
      auVar292 = packssdw(auVar215,auVar292);
      auVar215 = pmaddwd(auVar227,auVar145);
      auVar241 = pmaddwd(auVar240,auVar145);
      auVar241 = packssdw(auVar215,auVar241);
      auVar215 = pmaddwd(auVar189,auVar145);
      auVar160 = pmaddwd(auVar160,auVar145);
      auVar160 = packssdw(auVar215,auVar160);
      auVar245._0_12_ = auVar292._0_12_;
      auVar245._12_2_ = auVar292._6_2_;
      auVar245._14_2_ = auVar241._6_2_;
      auVar244._12_4_ = auVar245._12_4_;
      auVar244._0_10_ = auVar292._0_10_;
      auVar244._10_2_ = auVar241._4_2_;
      auVar243._10_6_ = auVar244._10_6_;
      auVar243._0_8_ = auVar292._0_8_;
      auVar243._8_2_ = auVar292._4_2_;
      auVar242._8_8_ = auVar243._8_8_;
      auVar242._6_2_ = auVar241._2_2_;
      auVar242._4_2_ = auVar292._2_2_;
      auVar242._0_2_ = auVar292._0_2_;
      auVar242._2_2_ = auVar241._0_2_;
      auVar216._2_2_ = auVar241._8_2_;
      auVar216._0_2_ = auVar292._8_2_;
      auVar216._4_2_ = auVar292._10_2_;
      auVar216._6_2_ = auVar241._10_2_;
      auVar216._8_2_ = auVar292._12_2_;
      auVar216._10_2_ = auVar241._12_2_;
      auVar216._12_2_ = auVar292._14_2_;
      auVar216._14_2_ = auVar241._14_2_;
      auVar163._0_12_ = auVar241._0_12_;
      auVar163._12_2_ = auVar241._6_2_;
      auVar163._14_2_ = auVar160._6_2_;
      auVar215._12_4_ = auVar163._12_4_;
      auVar215._0_10_ = auVar241._0_10_;
      auVar215._10_2_ = auVar160._4_2_;
      auVar162._10_6_ = auVar215._10_6_;
      auVar162._0_8_ = auVar241._0_8_;
      auVar162._8_2_ = auVar241._4_2_;
      auVar161._8_8_ = auVar162._8_8_;
      auVar161._6_2_ = auVar160._2_2_;
      auVar161._4_2_ = auVar241._2_2_;
      auVar161._2_2_ = auVar160._0_2_;
      auVar161._0_2_ = auVar241._0_2_;
      auVar228._2_2_ = auVar160._8_2_;
      auVar228._0_2_ = auVar241._8_2_;
      auVar228._4_2_ = auVar241._10_2_;
      auVar228._6_2_ = auVar160._10_2_;
      auVar228._8_2_ = auVar241._12_2_;
      auVar228._10_2_ = auVar160._12_2_;
      auVar228._12_2_ = auVar241._14_2_;
      auVar228._14_2_ = auVar160._14_2_;
      auVar215 = pmaddwd(auVar242,auVar146);
      auVar241 = pmaddwd(auVar216,auVar146);
      auVar160 = pmaddwd(auVar161,auVar147);
      auVar292 = pmaddwd(auVar228,auVar147);
      auVar190._0_4_ = auVar160._0_4_ + auVar215._0_4_ + 0x2020000 >> 0x12;
      auVar190._4_4_ = auVar160._4_4_ + auVar215._4_4_ + 0x2020000 >> 0x12;
      auVar190._8_4_ = auVar160._8_4_ + auVar215._8_4_ + 0x2020000 >> 0x12;
      auVar190._12_4_ = auVar160._12_4_ + auVar215._12_4_ + 0x2020000 >> 0x12;
      auVar270._0_4_ = auVar292._0_4_ + auVar241._0_4_ + 0x2020000 >> 0x12;
      auVar270._4_4_ = auVar292._4_4_ + auVar241._4_4_ + 0x2020000 >> 0x12;
      auVar270._8_4_ = auVar292._8_4_ + auVar241._8_4_ + 0x2020000 >> 0x12;
      auVar270._12_4_ = auVar292._12_4_ + auVar241._12_4_ + 0x2020000 >> 0x12;
      auVar241 = packssdw(auVar190,auVar270);
      auVar246 = pmaddwd(auVar242,auVar148);
      auVar215 = pmaddwd(auVar216,auVar148);
      auVar160 = pmaddwd(auVar161,auVar149);
      auVar292 = pmaddwd(auVar228,auVar149);
      auVar164._0_4_ = auVar160._0_4_ + auVar246._0_4_ + 0x2020000 >> 0x12;
      auVar164._4_4_ = auVar160._4_4_ + auVar246._4_4_ + 0x2020000 >> 0x12;
      auVar164._8_4_ = auVar160._8_4_ + auVar246._8_4_ + 0x2020000 >> 0x12;
      auVar164._12_4_ = auVar160._12_4_ + auVar246._12_4_ + 0x2020000 >> 0x12;
      auVar229._0_4_ = auVar292._0_4_ + auVar215._0_4_ + 0x2020000 >> 0x12;
      auVar229._4_4_ = auVar292._4_4_ + auVar215._4_4_ + 0x2020000 >> 0x12;
      auVar229._8_4_ = auVar292._8_4_ + auVar215._8_4_ + 0x2020000 >> 0x12;
      auVar229._12_4_ = auVar292._12_4_ + auVar215._12_4_ + 0x2020000 >> 0x12;
      auVar292 = packssdw(auVar164,auVar229);
      auVar160 = *(undefined1 (*) [16])(argb + uVar150 + 0x10);
      puVar1 = argb + uVar150 + 0x14;
      uVar40 = *(undefined1 *)((long)puVar1 + 3);
      uVar41 = *(undefined1 *)((long)puVar1 + 5);
      uVar42 = *(undefined1 *)((long)puVar1 + 9);
      uVar43 = *(undefined1 *)((long)puVar1 + 0xe);
      auVar215 = *(undefined1 (*) [16])(argb + uVar150 + 0x18);
      puVar2 = argb + uVar150 + 0x1c;
      uVar44 = *(undefined1 *)((long)puVar2 + 3);
      uVar45 = *(undefined1 *)((long)puVar2 + 5);
      uVar46 = *(undefined1 *)((long)puVar2 + 9);
      uVar47 = *(undefined1 *)((long)puVar2 + 0xe);
      auVar300._0_14_ = auVar160._0_14_;
      auVar300[0xe] = auVar160[7];
      auVar300[0xf] = *(undefined1 *)((long)puVar1 + 7);
      auVar299._14_2_ = auVar300._14_2_;
      auVar299._0_13_ = auVar160._0_13_;
      auVar299[0xd] = *(undefined1 *)((long)puVar1 + 6);
      auVar298._13_3_ = auVar299._13_3_;
      auVar298._0_12_ = auVar160._0_12_;
      auVar298[0xc] = auVar160[6];
      auVar297._12_4_ = auVar298._12_4_;
      auVar297._0_11_ = auVar160._0_11_;
      auVar297[0xb] = uVar41;
      uVar261 = auVar160[5];
      auVar296._11_5_ = auVar297._11_5_;
      auVar296._0_10_ = auVar160._0_10_;
      auVar296[10] = uVar261;
      auVar295._10_6_ = auVar296._10_6_;
      auVar295._0_9_ = auVar160._0_9_;
      auVar295[9] = (char)puVar1[1];
      auVar294._9_7_ = auVar295._9_7_;
      auVar294._0_8_ = auVar160._0_8_;
      auVar294[8] = auVar160[4];
      auVar85._1_8_ = auVar294._8_8_;
      auVar85[0] = uVar40;
      auVar85._9_7_ = 0;
      auVar84._10_6_ = 0;
      auVar84._0_10_ = SUB1610(auVar85 << 0x38,6);
      auVar83._11_5_ = 0;
      auVar83._0_11_ = SUB1611(auVar84 << 0x30,5);
      auVar82._12_4_ = 0;
      auVar82._0_12_ = SUB1612(auVar83 << 0x28,4);
      auVar81._13_3_ = 0;
      auVar81._0_13_ = SUB1613(auVar82 << 0x20,3);
      auVar293._14_2_ = 0;
      auVar293._0_14_ = SUB1614(auVar81 << 0x18,2);
      auVar293 = auVar293 << 0x10;
      auVar313._0_14_ = auVar215._0_14_;
      auVar313[0xe] = auVar215[7];
      auVar313[0xf] = *(undefined1 *)((long)puVar2 + 7);
      auVar312._14_2_ = auVar313._14_2_;
      auVar312._0_13_ = auVar215._0_13_;
      auVar312[0xd] = *(undefined1 *)((long)puVar2 + 6);
      auVar311._13_3_ = auVar312._13_3_;
      auVar311._0_12_ = auVar215._0_12_;
      auVar311[0xc] = auVar215[6];
      auVar310._12_4_ = auVar311._12_4_;
      auVar310._0_11_ = auVar215._0_11_;
      auVar310[0xb] = uVar45;
      uVar282 = auVar215[5];
      auVar309._11_5_ = auVar310._11_5_;
      auVar309._0_10_ = auVar215._0_10_;
      auVar309[10] = uVar282;
      auVar308._10_6_ = auVar309._10_6_;
      auVar308._0_9_ = auVar215._0_9_;
      auVar308[9] = (char)puVar2[1];
      auVar307._9_7_ = auVar308._9_7_;
      auVar307._0_8_ = auVar215._0_8_;
      auVar307[8] = auVar215[4];
      auVar90._1_8_ = auVar307._8_8_;
      auVar90[0] = uVar44;
      auVar90._9_7_ = 0;
      auVar89._10_6_ = 0;
      auVar89._0_10_ = SUB1610(auVar90 << 0x38,6);
      auVar88._11_5_ = 0;
      auVar88._0_11_ = SUB1611(auVar89 << 0x30,5);
      auVar87._12_4_ = 0;
      auVar87._0_12_ = SUB1612(auVar88 << 0x28,4);
      auVar86._13_3_ = 0;
      auVar86._0_13_ = SUB1613(auVar87 << 0x20,3);
      auVar306._14_2_ = 0;
      auVar306._0_14_ = SUB1614(auVar86 << 0x18,2);
      auVar306 = auVar306 << 0x10;
      auVar224._0_14_ = auVar293._0_14_;
      auVar224[0xe] = uVar40;
      auVar224[0xf] = *(undefined1 *)((long)puVar1 + 0xb);
      auVar223._14_2_ = auVar224._14_2_;
      auVar223._0_13_ = auVar293._0_13_;
      auVar223[0xd] = auVar160[0xb];
      auVar222._13_3_ = auVar223._13_3_;
      auVar222._0_12_ = auVar293._0_12_;
      auVar222[0xc] = auVar160[3];
      auVar221._12_4_ = auVar222._12_4_;
      auVar221._0_11_ = auVar293._0_11_;
      auVar221[0xb] = *(undefined1 *)((long)puVar1 + 10);
      auVar220._11_5_ = auVar221._11_5_;
      auVar220._0_10_ = auVar293._0_10_;
      auVar220[10] = *(undefined1 *)((long)puVar1 + 2);
      auVar219._10_6_ = auVar220._10_6_;
      auVar219._0_9_ = auVar293._0_9_;
      auVar219[9] = auVar160[10];
      auVar218._9_7_ = auVar219._9_7_;
      auVar218._0_8_ = auVar293._0_8_;
      auVar218[8] = auVar160[2];
      auVar95._1_8_ = auVar218._8_8_;
      auVar95[0] = uVar42;
      auVar95._9_7_ = 0;
      auVar94._10_6_ = 0;
      auVar94._0_10_ = SUB1610(auVar95 << 0x38,6);
      auVar93._11_5_ = 0;
      auVar93._0_11_ = SUB1611(auVar94 << 0x30,5);
      auVar92._12_4_ = 0;
      auVar92._0_12_ = SUB1612(auVar93 << 0x28,4);
      auVar91._13_3_ = 0;
      auVar91._0_13_ = SUB1613(auVar92 << 0x20,3);
      auVar217._14_2_ = 0;
      auVar217._0_14_ = SUB1614(auVar91 << 0x18,2);
      auVar217 = auVar217 << 0x10;
      auVar321._0_14_ = auVar306._0_14_;
      auVar321[0xe] = uVar44;
      auVar321[0xf] = *(undefined1 *)((long)puVar2 + 0xb);
      auVar320._14_2_ = auVar321._14_2_;
      auVar320._0_13_ = auVar306._0_13_;
      auVar320[0xd] = auVar215[0xb];
      auVar319._13_3_ = auVar320._13_3_;
      auVar319._0_12_ = auVar306._0_12_;
      auVar319[0xc] = auVar215[3];
      auVar318._12_4_ = auVar319._12_4_;
      auVar318._0_11_ = auVar306._0_11_;
      auVar318[0xb] = *(undefined1 *)((long)puVar2 + 10);
      auVar317._11_5_ = auVar318._11_5_;
      auVar317._0_10_ = auVar306._0_10_;
      auVar317[10] = *(undefined1 *)((long)puVar2 + 2);
      auVar316._10_6_ = auVar317._10_6_;
      auVar316._0_9_ = auVar306._0_9_;
      auVar316[9] = auVar215[10];
      auVar315._9_7_ = auVar316._9_7_;
      auVar315._0_8_ = auVar306._0_8_;
      auVar315[8] = auVar215[2];
      auVar100._1_8_ = auVar315._8_8_;
      auVar100[0] = uVar46;
      auVar100._9_7_ = 0;
      auVar99._10_6_ = 0;
      auVar99._0_10_ = SUB1610(auVar100 << 0x38,6);
      auVar98._11_5_ = 0;
      auVar98._0_11_ = SUB1611(auVar99 << 0x30,5);
      auVar97._12_4_ = 0;
      auVar97._0_12_ = SUB1612(auVar98 << 0x28,4);
      auVar96._13_3_ = 0;
      auVar96._0_13_ = SUB1613(auVar97 << 0x20,3);
      auVar314._14_2_ = 0;
      auVar314._0_14_ = SUB1614(auVar96 << 0x18,2);
      auVar314 = auVar314 << 0x10;
      auVar278._0_14_ = auVar217._0_14_;
      auVar278[0xe] = uVar42;
      auVar278[0xf] = *(undefined1 *)((long)puVar1 + 0xd);
      auVar277._14_2_ = auVar278._14_2_;
      auVar277._0_13_ = auVar217._0_13_;
      auVar277[0xd] = uVar41;
      auVar276._13_3_ = auVar277._13_3_;
      auVar276._0_12_ = auVar217._0_12_;
      auVar276[0xc] = *(undefined1 *)((long)puVar1 + 1);
      auVar275._12_4_ = auVar276._12_4_;
      auVar275._0_11_ = auVar217._0_11_;
      auVar275[0xb] = auVar160[0xd];
      auVar274._11_5_ = auVar275._11_5_;
      auVar274._0_10_ = auVar217._0_10_;
      auVar274[10] = auVar160[9];
      auVar273._10_6_ = auVar274._10_6_;
      auVar273._0_9_ = auVar217._0_9_;
      auVar273[9] = uVar261;
      auVar272._9_7_ = auVar273._9_7_;
      auVar272._0_8_ = auVar217._0_8_;
      auVar272[8] = auVar160[1];
      auVar105._1_8_ = auVar272._8_8_;
      auVar105[0] = (char)puVar1[3];
      auVar105._9_7_ = 0;
      auVar104._10_6_ = 0;
      auVar104._0_10_ = SUB1610(auVar105 << 0x38,6);
      auVar103._11_5_ = 0;
      auVar103._0_11_ = SUB1611(auVar104 << 0x30,5);
      auVar102._12_4_ = 0;
      auVar102._0_12_ = SUB1612(auVar103 << 0x28,4);
      auVar101._13_3_ = 0;
      auVar101._0_13_ = SUB1613(auVar102 << 0x20,3);
      auVar271._14_2_ = 0;
      auVar271._0_14_ = SUB1614(auVar101 << 0x18,2);
      auVar271 = auVar271 << 0x10;
      uVar70 = CONCAT11(auVar160[3],uVar43);
      uVar115 = CONCAT12(auVar160[7],uVar70);
      uVar133 = CONCAT13(auVar160[0xb],uVar115);
      uVar135 = CONCAT14(auVar160[0xf],uVar133);
      auVar143[5] = uVar40;
      auVar143._0_5_ = uVar135;
      auVar254._0_14_ = auVar314._0_14_;
      auVar254[0xe] = uVar46;
      auVar254[0xf] = *(undefined1 *)((long)puVar2 + 0xd);
      auVar253._14_2_ = auVar254._14_2_;
      auVar253._0_13_ = auVar314._0_13_;
      auVar253[0xd] = uVar45;
      auVar252._13_3_ = auVar253._13_3_;
      auVar252._0_12_ = auVar314._0_12_;
      auVar252[0xc] = *(undefined1 *)((long)puVar2 + 1);
      auVar251._12_4_ = auVar252._12_4_;
      auVar251._0_11_ = auVar314._0_11_;
      auVar251[0xb] = auVar215[0xd];
      auVar250._11_5_ = auVar251._11_5_;
      auVar250._0_10_ = auVar314._0_10_;
      auVar250[10] = auVar215[9];
      auVar249._10_6_ = auVar250._10_6_;
      auVar249._0_9_ = auVar314._0_9_;
      auVar249[9] = uVar282;
      auVar248._9_7_ = auVar249._9_7_;
      auVar248._0_8_ = auVar314._0_8_;
      auVar248[8] = auVar215[1];
      auVar110._1_8_ = auVar248._8_8_;
      auVar110[0] = (char)puVar2[3];
      auVar110._9_7_ = 0;
      auVar109._10_6_ = 0;
      auVar109._0_10_ = SUB1610(auVar110 << 0x38,6);
      auVar108._11_5_ = 0;
      auVar108._0_11_ = SUB1611(auVar109 << 0x30,5);
      auVar107._12_4_ = 0;
      auVar107._0_12_ = SUB1612(auVar108 << 0x28,4);
      auVar106._13_3_ = 0;
      auVar106._0_13_ = SUB1613(auVar107 << 0x20,3);
      auVar247._14_2_ = 0;
      auVar247._0_14_ = SUB1614(auVar106 << 0x18,2);
      auVar247 = auVar247 << 0x10;
      uVar76 = CONCAT11(auVar215[3],uVar47);
      uVar116 = CONCAT12(auVar215[7],uVar76);
      uVar134 = CONCAT13(auVar215[0xb],uVar116);
      uVar136 = CONCAT14(auVar215[0xf],uVar134);
      auVar144[5] = uVar44;
      auVar144._0_5_ = uVar136;
      auVar143._6_8_ = 0;
      auVar8[0xe] = uVar43;
      auVar8._0_14_ = auVar143 << 0x38;
      auVar139._4_8_ = 0;
      auVar139._0_4_ = uVar133;
      auVar20._12_3_ =
           (int3)(CONCAT26(auVar8._13_2_,CONCAT15(*(undefined1 *)((long)puVar1 + 10),uVar135)) >>
                 0x28);
      auVar20._0_12_ = auVar139 << 0x38;
      auVar32._10_5_ =
           (int5)(CONCAT44(auVar20._11_4_,CONCAT13(*(undefined1 *)((long)puVar1 + 6),uVar115)) >>
                 0x18);
      auVar32._0_10_ = (unkuint10)uVar70 << 0x38;
      auVar111._7_8_ = 0;
      auVar111._0_7_ =
           (uint7)(CONCAT62(auVar32._9_6_,CONCAT11(*(undefined1 *)((long)puVar1 + 2),uVar43)) >> 8);
      auVar125._1_8_ = SUB158(auVar111 << 0x40,7);
      auVar125[0] = auVar160[0xe];
      auVar125._9_6_ = 0;
      auVar126._1_10_ = SUB1510(auVar125 << 0x30,5);
      auVar126[0] = auVar160[10];
      auVar126._11_4_ = 0;
      auVar225._3_12_ = SUB1512(auVar126 << 0x20,3);
      auVar225[2] = auVar160[6];
      auVar225[1] = 0;
      auVar225[0] = auVar160[2];
      auVar225[0xf] = 0;
      auVar144._6_8_ = 0;
      auVar9[0xe] = uVar47;
      auVar9._0_14_ = auVar144 << 0x38;
      auVar140._4_8_ = 0;
      auVar140._0_4_ = uVar134;
      auVar21._12_3_ =
           (int3)(CONCAT26(auVar9._13_2_,CONCAT15(*(undefined1 *)((long)puVar2 + 10),uVar136)) >>
                 0x28);
      auVar21._0_12_ = auVar140 << 0x38;
      auVar33._10_5_ =
           (int5)(CONCAT44(auVar21._11_4_,CONCAT13(*(undefined1 *)((long)puVar2 + 6),uVar116)) >>
                 0x18);
      auVar33._0_10_ = (unkuint10)uVar76 << 0x38;
      auVar112._7_8_ = 0;
      auVar112._0_7_ =
           (uint7)(CONCAT62(auVar33._9_6_,CONCAT11(*(undefined1 *)((long)puVar2 + 2),uVar47)) >> 8);
      auVar127._1_8_ = SUB158(auVar112 << 0x40,7);
      auVar127[0] = auVar215[0xe];
      auVar127._9_6_ = 0;
      auVar128._1_10_ = SUB1510(auVar127 << 0x30,5);
      auVar128[0] = auVar215[10];
      auVar128._11_4_ = 0;
      auVar322._3_12_ = SUB1512(auVar128 << 0x20,3);
      auVar322[2] = auVar215[6];
      auVar322[1] = 0;
      auVar322[0] = auVar215[2];
      auVar322[0xf] = 0;
      auVar230[1] = 0;
      auVar230[0] = auVar160[1];
      auVar230[2] = uVar261;
      auVar230[3] = 0;
      auVar230[4] = auVar160[9];
      auVar230[5] = 0;
      auVar230[6] = auVar160[0xd];
      auVar230[7] = 0;
      auVar230[8] = *(undefined1 *)((long)puVar1 + 1);
      auVar230[9] = 0;
      auVar230[10] = uVar41;
      auVar230[0xb] = 0;
      auVar230[0xc] = uVar42;
      auVar230[0xd] = 0;
      auVar230[0xe] = *(undefined1 *)((long)puVar1 + 0xd);
      auVar230[0xf] = 0;
      auVar301[1] = 0;
      auVar301[0] = auVar215[1];
      auVar301[2] = uVar282;
      auVar301[3] = 0;
      auVar301[4] = auVar215[9];
      auVar301[5] = 0;
      auVar301[6] = auVar215[0xd];
      auVar301[7] = 0;
      auVar301[8] = *(undefined1 *)((long)puVar2 + 1);
      auVar301[9] = 0;
      auVar301[10] = uVar45;
      auVar301[0xb] = 0;
      auVar301[0xc] = uVar46;
      auVar301[0xd] = 0;
      auVar301[0xe] = *(undefined1 *)((long)puVar2 + 0xd);
      auVar301[0xf] = 0;
      auVar10[0xd] = 0;
      auVar10._0_13_ = auVar271._0_13_;
      auVar10[0xe] = (char)puVar1[3];
      auVar14[0xc] = (char)puVar1[2];
      auVar14._0_12_ = auVar271._0_12_;
      auVar14._13_2_ = auVar10._13_2_;
      auVar22[0xb] = 0;
      auVar22._0_11_ = auVar271._0_11_;
      auVar22._12_3_ = auVar14._12_3_;
      auVar26[10] = (char)puVar1[1];
      auVar26._0_10_ = auVar271._0_10_;
      auVar26._11_4_ = auVar22._11_4_;
      auVar34[9] = 0;
      auVar34._0_9_ = auVar271._0_9_;
      auVar34._10_5_ = auVar26._10_5_;
      auVar38[8] = (char)*puVar1;
      auVar38._0_8_ = auVar271._0_8_;
      auVar38._9_6_ = auVar34._9_6_;
      auVar113._7_8_ = 0;
      auVar113._0_7_ = auVar38._8_7_;
      auVar129._1_8_ = SUB158(auVar113 << 0x40,7);
      auVar129[0] = auVar160[0xc];
      auVar129._9_6_ = 0;
      auVar130._1_10_ = SUB1510(auVar129 << 0x30,5);
      auVar130[0] = auVar160[8];
      auVar130._11_4_ = 0;
      auVar279._3_12_ = SUB1512(auVar130 << 0x20,3);
      auVar279[2] = auVar160[4];
      auVar279[1] = 0;
      auVar279[0] = auVar160[0];
      auVar279[0xf] = 0;
      auVar11[0xd] = 0;
      auVar11._0_13_ = auVar247._0_13_;
      auVar11[0xe] = (char)puVar2[3];
      auVar15[0xc] = (char)puVar2[2];
      auVar15._0_12_ = auVar247._0_12_;
      auVar15._13_2_ = auVar11._13_2_;
      auVar23[0xb] = 0;
      auVar23._0_11_ = auVar247._0_11_;
      auVar23._12_3_ = auVar15._12_3_;
      auVar27[10] = (char)puVar2[1];
      auVar27._0_10_ = auVar247._0_10_;
      auVar27._11_4_ = auVar23._11_4_;
      auVar35[9] = 0;
      auVar35._0_9_ = auVar247._0_9_;
      auVar35._10_5_ = auVar27._10_5_;
      auVar39[8] = (char)*puVar2;
      auVar39._0_8_ = auVar247._0_8_;
      auVar39._9_6_ = auVar35._9_6_;
      auVar114._7_8_ = 0;
      auVar114._0_7_ = auVar39._8_7_;
      auVar131._1_8_ = SUB158(auVar114 << 0x40,7);
      auVar131[0] = auVar215[0xc];
      auVar131._9_6_ = 0;
      auVar132._1_10_ = SUB1510(auVar131 << 0x30,5);
      auVar132[0] = auVar215[8];
      auVar132._11_4_ = 0;
      auVar255._3_12_ = SUB1512(auVar132 << 0x20,3);
      auVar255[2] = auVar215[4];
      auVar255[1] = 0;
      auVar255[0] = auVar215[0];
      auVar255[0xf] = 0;
      auVar160 = pmaddwd(auVar225,auVar145);
      auVar215 = pmaddwd(auVar322,auVar145);
      auVar160 = packssdw(auVar160,auVar215);
      auVar215 = pmaddwd(auVar230,auVar145);
      auVar246 = pmaddwd(auVar301,auVar145);
      auVar215 = packssdw(auVar215,auVar246);
      auVar280 = pmaddwd(auVar279,auVar145);
      auVar246 = pmaddwd(auVar255,auVar145);
      auVar246 = packssdw(auVar280,auVar246);
      auVar305._0_12_ = auVar160._0_12_;
      auVar305._12_2_ = auVar160._6_2_;
      auVar305._14_2_ = auVar215._6_2_;
      auVar304._12_4_ = auVar305._12_4_;
      auVar304._0_10_ = auVar160._0_10_;
      auVar304._10_2_ = auVar215._4_2_;
      auVar303._10_6_ = auVar304._10_6_;
      auVar303._0_8_ = auVar160._0_8_;
      auVar303._8_2_ = auVar160._4_2_;
      auVar302._8_8_ = auVar303._8_8_;
      auVar302._6_2_ = auVar215._2_2_;
      auVar302._4_2_ = auVar160._2_2_;
      auVar302._0_2_ = auVar160._0_2_;
      auVar302._2_2_ = auVar215._0_2_;
      auVar226._2_2_ = auVar215._8_2_;
      auVar226._0_2_ = auVar160._8_2_;
      auVar226._4_2_ = auVar160._10_2_;
      auVar226._6_2_ = auVar215._10_2_;
      auVar226._8_2_ = auVar160._12_2_;
      auVar226._10_2_ = auVar215._12_2_;
      auVar226._12_2_ = auVar160._14_2_;
      auVar226._14_2_ = auVar215._14_2_;
      auVar259._0_12_ = auVar215._0_12_;
      auVar259._12_2_ = auVar215._6_2_;
      auVar259._14_2_ = auVar246._6_2_;
      auVar258._12_4_ = auVar259._12_4_;
      auVar258._0_10_ = auVar215._0_10_;
      auVar258._10_2_ = auVar246._4_2_;
      auVar257._10_6_ = auVar258._10_6_;
      auVar257._0_8_ = auVar215._0_8_;
      auVar257._8_2_ = auVar215._4_2_;
      auVar256._8_8_ = auVar257._8_8_;
      auVar256._6_2_ = auVar246._2_2_;
      auVar256._4_2_ = auVar215._2_2_;
      auVar256._2_2_ = auVar246._0_2_;
      auVar256._0_2_ = auVar215._0_2_;
      auVar231._2_2_ = auVar246._8_2_;
      auVar231._0_2_ = auVar215._8_2_;
      auVar231._4_2_ = auVar215._10_2_;
      auVar231._6_2_ = auVar246._10_2_;
      auVar231._8_2_ = auVar215._12_2_;
      auVar231._10_2_ = auVar246._12_2_;
      auVar231._12_2_ = auVar215._14_2_;
      auVar231._14_2_ = auVar246._14_2_;
      auVar160 = pmaddwd(auVar302,auVar146);
      auVar246 = pmaddwd(auVar226,auVar146);
      auVar280 = pmaddwd(auVar256,auVar147);
      auVar215 = pmaddwd(auVar231,auVar147);
      auVar323._0_4_ = auVar280._0_4_ + auVar160._0_4_ + 0x2020000 >> 0x12;
      auVar323._4_4_ = auVar280._4_4_ + auVar160._4_4_ + 0x2020000 >> 0x12;
      auVar323._8_4_ = auVar280._8_4_ + auVar160._8_4_ + 0x2020000 >> 0x12;
      auVar323._12_4_ = auVar280._12_4_ + auVar160._12_4_ + 0x2020000 >> 0x12;
      auVar281._0_4_ = auVar215._0_4_ + auVar246._0_4_ + 0x2020000 >> 0x12;
      auVar281._4_4_ = auVar215._4_4_ + auVar246._4_4_ + 0x2020000 >> 0x12;
      auVar281._8_4_ = auVar215._8_4_ + auVar246._8_4_ + 0x2020000 >> 0x12;
      auVar281._12_4_ = auVar215._12_4_ + auVar246._12_4_ + 0x2020000 >> 0x12;
      auVar160 = packssdw(auVar323,auVar281);
      sVar3 = auVar241._0_2_;
      uVar180 = (0 < sVar3) * (sVar3 < 0x100) * auVar241[0] - (0xff < sVar3);
      sVar3 = auVar241._2_2_;
      uVar191 = (0 < sVar3) * (sVar3 < 0x100) * auVar241[2] - (0xff < sVar3);
      sVar3 = auVar241._4_2_;
      uVar192 = (0 < sVar3) * (sVar3 < 0x100) * auVar241[4] - (0xff < sVar3);
      sVar3 = auVar241._6_2_;
      uVar193 = (0 < sVar3) * (sVar3 < 0x100) * auVar241[6] - (0xff < sVar3);
      sVar3 = auVar241._8_2_;
      uVar194 = (0 < sVar3) * (sVar3 < 0x100) * auVar241[8] - (0xff < sVar3);
      sVar3 = auVar241._10_2_;
      uVar195 = (0 < sVar3) * (sVar3 < 0x100) * auVar241[10] - (0xff < sVar3);
      sVar3 = auVar241._12_2_;
      uVar196 = (0 < sVar3) * (sVar3 < 0x100) * auVar241[0xc] - (0xff < sVar3);
      sVar3 = auVar241._14_2_;
      uVar197 = (0 < sVar3) * (sVar3 < 0x100) * auVar241[0xe] - (0xff < sVar3);
      sVar3 = auVar160._0_2_;
      uVar198 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[0] - (0xff < sVar3);
      sVar3 = auVar160._2_2_;
      uVar199 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[2] - (0xff < sVar3);
      sVar3 = auVar160._4_2_;
      uVar200 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[4] - (0xff < sVar3);
      sVar3 = auVar160._6_2_;
      uVar201 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[6] - (0xff < sVar3);
      sVar3 = auVar160._8_2_;
      uVar202 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[8] - (0xff < sVar3);
      sVar3 = auVar160._10_2_;
      uVar203 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[10] - (0xff < sVar3);
      sVar3 = auVar160._12_2_;
      uVar204 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[0xc] - (0xff < sVar3);
      sVar3 = auVar160._14_2_;
      uVar205 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[0xe] - (0xff < sVar3);
      auVar246 = pmaddwd(auVar302,auVar148);
      auVar160 = pmaddwd(auVar226,auVar148);
      auVar241 = pmaddwd(auVar256,auVar149);
      auVar215 = pmaddwd(auVar231,auVar149);
      auVar260._0_4_ = auVar241._0_4_ + auVar246._0_4_ + 0x2020000 >> 0x12;
      auVar260._4_4_ = auVar241._4_4_ + auVar246._4_4_ + 0x2020000 >> 0x12;
      auVar260._8_4_ = auVar241._8_4_ + auVar246._8_4_ + 0x2020000 >> 0x12;
      auVar260._12_4_ = auVar241._12_4_ + auVar246._12_4_ + 0x2020000 >> 0x12;
      auVar232._0_4_ = auVar215._0_4_ + auVar160._0_4_ + 0x2020000 >> 0x12;
      auVar232._4_4_ = auVar215._4_4_ + auVar160._4_4_ + 0x2020000 >> 0x12;
      auVar232._8_4_ = auVar215._8_4_ + auVar160._8_4_ + 0x2020000 >> 0x12;
      auVar232._12_4_ = auVar215._12_4_ + auVar160._12_4_ + 0x2020000 >> 0x12;
      auVar160 = packssdw(auVar260,auVar232);
      sVar3 = auVar292._0_2_;
      uVar151 = (0 < sVar3) * (sVar3 < 0x100) * auVar292[0] - (0xff < sVar3);
      sVar3 = auVar292._2_2_;
      uVar165 = (0 < sVar3) * (sVar3 < 0x100) * auVar292[2] - (0xff < sVar3);
      sVar3 = auVar292._4_2_;
      uVar166 = (0 < sVar3) * (sVar3 < 0x100) * auVar292[4] - (0xff < sVar3);
      sVar3 = auVar292._6_2_;
      uVar167 = (0 < sVar3) * (sVar3 < 0x100) * auVar292[6] - (0xff < sVar3);
      sVar3 = auVar292._8_2_;
      uVar168 = (0 < sVar3) * (sVar3 < 0x100) * auVar292[8] - (0xff < sVar3);
      sVar3 = auVar292._10_2_;
      uVar169 = (0 < sVar3) * (sVar3 < 0x100) * auVar292[10] - (0xff < sVar3);
      sVar3 = auVar292._12_2_;
      uVar170 = (0 < sVar3) * (sVar3 < 0x100) * auVar292[0xc] - (0xff < sVar3);
      sVar3 = auVar292._14_2_;
      uVar171 = (0 < sVar3) * (sVar3 < 0x100) * auVar292[0xe] - (0xff < sVar3);
      sVar3 = auVar160._0_2_;
      uVar172 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[0] - (0xff < sVar3);
      sVar3 = auVar160._2_2_;
      uVar173 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[2] - (0xff < sVar3);
      sVar3 = auVar160._4_2_;
      uVar174 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[4] - (0xff < sVar3);
      sVar3 = auVar160._6_2_;
      uVar175 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[6] - (0xff < sVar3);
      sVar3 = auVar160._8_2_;
      uVar176 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[8] - (0xff < sVar3);
      sVar3 = auVar160._10_2_;
      uVar177 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[10] - (0xff < sVar3);
      sVar3 = auVar160._12_2_;
      uVar178 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[0xc] - (0xff < sVar3);
      sVar3 = auVar160._14_2_;
      uVar179 = (0 < sVar3) * (sVar3 < 0x100) * auVar160[0xe] - (0xff < sVar3);
      if (do_store == 0) {
        uVar180 = pavgb(uVar180,*u);
        uVar191 = pavgb(uVar191,u[1]);
        uVar192 = pavgb(uVar192,u[2]);
        uVar193 = pavgb(uVar193,u[3]);
        uVar194 = pavgb(uVar194,u[4]);
        uVar195 = pavgb(uVar195,u[5]);
        uVar196 = pavgb(uVar196,u[6]);
        uVar197 = pavgb(uVar197,u[7]);
        uVar198 = pavgb(uVar198,u[8]);
        uVar199 = pavgb(uVar199,u[9]);
        uVar200 = pavgb(uVar200,u[10]);
        uVar201 = pavgb(uVar201,u[0xb]);
        uVar202 = pavgb(uVar202,u[0xc]);
        uVar203 = pavgb(uVar203,u[0xd]);
        uVar204 = pavgb(uVar204,u[0xe]);
        uVar205 = pavgb(uVar205,u[0xf]);
        uVar151 = pavgb(uVar151,*v);
        uVar165 = pavgb(uVar165,v[1]);
        uVar166 = pavgb(uVar166,v[2]);
        uVar167 = pavgb(uVar167,v[3]);
        uVar168 = pavgb(uVar168,v[4]);
        uVar169 = pavgb(uVar169,v[5]);
        uVar170 = pavgb(uVar170,v[6]);
        uVar171 = pavgb(uVar171,v[7]);
        uVar172 = pavgb(uVar172,v[8]);
        uVar173 = pavgb(uVar173,v[9]);
        uVar174 = pavgb(uVar174,v[10]);
        uVar175 = pavgb(uVar175,v[0xb]);
        uVar176 = pavgb(uVar176,v[0xc]);
        uVar177 = pavgb(uVar177,v[0xd]);
        uVar178 = pavgb(uVar178,v[0xe]);
        uVar179 = pavgb(uVar179,v[0xf]);
      }
      *u = uVar180;
      u[1] = uVar191;
      u[2] = uVar192;
      u[3] = uVar193;
      u[4] = uVar194;
      u[5] = uVar195;
      u[6] = uVar196;
      u[7] = uVar197;
      u[8] = uVar198;
      u[9] = uVar199;
      u[10] = uVar200;
      u[0xb] = uVar201;
      u[0xc] = uVar202;
      u[0xd] = uVar203;
      u[0xe] = uVar204;
      u[0xf] = uVar205;
      *v = uVar151;
      v[1] = uVar165;
      v[2] = uVar166;
      v[3] = uVar167;
      v[4] = uVar168;
      v[5] = uVar169;
      v[6] = uVar170;
      v[7] = uVar171;
      v[8] = uVar172;
      v[9] = uVar173;
      v[10] = uVar174;
      v[0xb] = uVar175;
      v[0xc] = uVar176;
      v[0xd] = uVar177;
      v[0xe] = uVar178;
      v[0xf] = uVar179;
      uVar150 = uVar150 + 0x20;
      u = u + 0x10;
      v = v + 0x10;
    } while (uVar150 < (src_width & 0xffffffe0U));
  }
  src_width_00 = src_width - (int)uVar150;
  if (src_width_00 == 0 || src_width < (int)uVar150) {
    return;
  }
  WebPConvertARGBToUV_C(argb + (uVar150 & 0xffffffff),u,v,src_width_00,do_store);
  return;
}

Assistant:

static void ConvertARGBToUV_SSE2(const uint32_t* WEBP_RESTRICT argb,
                                 uint8_t* WEBP_RESTRICT u,
                                 uint8_t* WEBP_RESTRICT v,
                                 int src_width, int do_store) {
  const int max_width = src_width & ~31;
  int i;
  for (i = 0; i < max_width; i += 32, u += 16, v += 16) {
    __m128i rgb[6], U0, V0, U1, V1;
    RGB32PackedToPlanar_SSE2(&argb[i], rgb);
    HorizontalAddPack_SSE2(&rgb[0], &rgb[1], &rgb[0]);
    HorizontalAddPack_SSE2(&rgb[2], &rgb[3], &rgb[2]);
    HorizontalAddPack_SSE2(&rgb[4], &rgb[5], &rgb[4]);
    ConvertRGBToUV_SSE2(&rgb[0], &rgb[2], &rgb[4], &U0, &V0);

    RGB32PackedToPlanar_SSE2(&argb[i + 16], rgb);
    HorizontalAddPack_SSE2(&rgb[0], &rgb[1], &rgb[0]);
    HorizontalAddPack_SSE2(&rgb[2], &rgb[3], &rgb[2]);
    HorizontalAddPack_SSE2(&rgb[4], &rgb[5], &rgb[4]);
    ConvertRGBToUV_SSE2(&rgb[0], &rgb[2], &rgb[4], &U1, &V1);

    U0 = _mm_packus_epi16(U0, U1);
    V0 = _mm_packus_epi16(V0, V1);
    if (!do_store) {
      const __m128i prev_u = LOAD_16(u);
      const __m128i prev_v = LOAD_16(v);
      U0 = _mm_avg_epu8(U0, prev_u);
      V0 = _mm_avg_epu8(V0, prev_v);
    }
    STORE_16(U0, u);
    STORE_16(V0, v);
  }
  if (i < src_width) {  // left-over
    WebPConvertARGBToUV_C(argb + i, u, v, src_width - i, do_store);
  }
}